

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getpart.c
# Opt level: O0

int getpart(char **outbuf,size_t *outlen,char *main,char *sub,FILE *stream)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  ushort **ppuVar4;
  anon_union_8_2_43af0e2a aVar5;
  bool bVar6;
  int local_208;
  int local_204;
  anon_enum_32 state;
  int error;
  int base64;
  int in_wanted_part;
  size_t outalloc;
  size_t bufsize;
  anon_union_8_2_43af0e2a len;
  char *end;
  char *ptr;
  char *buffer;
  char patt [80];
  char ptag [80];
  char csub [80];
  char cmain [80];
  char couter [80];
  FILE *stream_local;
  char *sub_local;
  char *main_local;
  size_t *outlen_local;
  char **outbuf_local;
  
  ptr = (char *)0x0;
  outalloc = 0;
  _base64 = 0x100;
  bVar1 = false;
  state = STATE_OUTSIDE;
  local_208 = 0;
  *outlen = 0;
  pcVar3 = (char *)(*Curl_cmalloc)(0x100);
  *outbuf = pcVar3;
  if (*outbuf == (char *)0x0) {
    outbuf_local._4_4_ = -1;
  }
  else {
    **outbuf = '\0';
    buffer._0_1_ = 0;
    patt[0x48] = '\0';
    ptag[0x48] = '\0';
    csub[0x48] = '\0';
    cmain[0x48] = '\0';
LAB_00106403:
    while( true ) {
      local_204 = readline(&ptr,&outalloc,stream);
      if (local_204 != 0) goto LAB_00106adb;
      end = ptr;
      while( true ) {
        bVar6 = false;
        if (*end != '\0') {
          ppuVar4 = __ctype_b_loc();
          bVar6 = ((*ppuVar4)[(int)(uint)(byte)*end] & 0x2000) != 0;
        }
        if (!bVar6) break;
        end = end + 1;
      }
      if (*end == '<') break;
      if ((bVar1) &&
         (local_204 = appenddata(outbuf,outlen,(size_t *)&base64,ptr,state), local_204 != 0))
      goto LAB_00106adb;
    }
    aVar5.sig = (long)end + 1;
    if (*(char *)aVar5 == '/') {
      len.sig = (long)end + 2;
      end = (char *)len.sig;
      while( true ) {
        bVar6 = false;
        if (*(char *)len != '\0') {
          ppuVar4 = __ctype_b_loc();
          bVar6 = false;
          if (((*ppuVar4)[(int)(uint)*(byte *)len] & 0x2000) == 0) {
            bVar6 = *(char *)len != '>';
          }
        }
        if (!bVar6) break;
        len.sig = len.sig + 1;
      }
      bufsize = len.sig - (long)end;
      if (0x4f < (long)bufsize) {
        local_204 = -2;
        goto LAB_00106adb;
      }
      memcpy(patt + 0x48,end,bufsize);
      patt[bufsize + 0x48] = '\0';
      if ((local_208 == 3) && (iVar2 = strcmp(ptag + 0x48,patt + 0x48), iVar2 == 0)) {
        local_208 = 2;
        ptag[0x48] = '\0';
        if (bVar1) {
          if (state != STATE_OUTSIDE) {
            local_204 = decodedata(outbuf,outlen);
joined_r0x00106705:
            if (local_204 != 0) {
              return local_204;
            }
          }
          goto LAB_00106adb;
        }
      }
      else if ((local_208 == 2) && (iVar2 = strcmp(csub + 0x48,patt + 0x48), iVar2 == 0)) {
        local_208 = 1;
        csub[0x48] = '\0';
        if (bVar1) {
          if (state != STATE_OUTSIDE) {
            local_204 = decodedata(outbuf,outlen);
            goto joined_r0x00106705;
          }
          goto LAB_00106adb;
        }
      }
      else if ((local_208 == 1) && (iVar2 = strcmp(cmain + 0x48,patt + 0x48), iVar2 == 0)) {
        local_208 = 0;
        cmain[0x48] = '\0';
        if (bVar1) goto LAB_00106adb;
      }
    }
    else {
      end = (char *)aVar5.sig;
      if (!bVar1) {
        while( true ) {
          len = aVar5;
          bVar6 = false;
          if (*(char *)len != '\0') {
            ppuVar4 = __ctype_b_loc();
            bVar6 = false;
            if (((*ppuVar4)[(int)(uint)*(byte *)len] & 0x2000) == 0) {
              bVar6 = *(char *)len != '>';
            }
          }
          if (!bVar6) break;
          aVar5.sig = len.sig + 1;
        }
        bufsize = len.sig - (long)end;
        if (0x4f < (long)bufsize) {
          local_204 = -2;
          goto LAB_00106adb;
        }
        memcpy(patt + 0x48,end,bufsize);
        patt[bufsize + 0x48] = '\0';
        if ((patt[0x48] == '!') || (patt[0x48] == '?')) goto LAB_00106403;
        end = (char *)len;
        while( true ) {
          bVar6 = false;
          if (*end != '\0') {
            ppuVar4 = __ctype_b_loc();
            bVar6 = ((*ppuVar4)[(int)(uint)(byte)*end] & 0x2000) != 0;
          }
          if (!bVar6) break;
          end = end + 1;
        }
        len = (anon_union_8_2_43af0e2a)end;
        while( true ) {
          bVar6 = false;
          if (*(char *)len != '\0') {
            bVar6 = *(char *)len != '>';
          }
          if (!bVar6) break;
          len.sig = len.sig + 1;
        }
        bufsize = len.sig - (long)end;
        if (0x4f < (long)bufsize) {
          local_204 = -2;
          goto LAB_00106adb;
        }
        memcpy(&buffer,end,bufsize);
        patt[bufsize - 8] = '\0';
        if (local_208 == 0) {
          strcpy(cmain + 0x48,patt + 0x48);
          local_208 = 1;
          goto LAB_00106403;
        }
        if (local_208 == 1) {
          strcpy(csub + 0x48,patt + 0x48);
          local_208 = 2;
          goto LAB_00106403;
        }
        if (local_208 == 2) {
          strcpy(ptag + 0x48,patt + 0x48);
          local_208 = 3;
          iVar2 = strcmp(csub + 0x48,main);
          if ((iVar2 == 0) && (iVar2 = strcmp(ptag + 0x48,sub), iVar2 == 0)) {
            bVar1 = true;
            pcVar3 = strstr((char *)&buffer,"base64=");
            if (pcVar3 != (char *)0x0) {
              state = STATE_OUTER;
            }
          }
          goto LAB_00106403;
        }
      }
    }
    if ((!bVar1) ||
       (local_204 = appenddata(outbuf,outlen,(size_t *)&base64,ptr,state), local_204 == 0))
    goto LAB_00106403;
LAB_00106adb:
    (*Curl_cfree)(ptr);
    if (local_204 != 0) {
      if (local_204 == 1) {
        local_204 = 0;
      }
      else {
        (*Curl_cfree)(*outbuf);
        *outbuf = (char *)0x0;
        *outlen = 0;
      }
    }
    outbuf_local._4_4_ = local_204;
  }
  return outbuf_local._4_4_;
}

Assistant:

int getpart(char **outbuf, size_t *outlen,
            const char *main, const char *sub, FILE *stream)
{
# define MAX_TAG_LEN 79
  char couter[MAX_TAG_LEN+1]; /* current outermost section */
  char cmain[MAX_TAG_LEN+1];  /* current main section */
  char csub[MAX_TAG_LEN+1];   /* current sub section */
  char ptag[MAX_TAG_LEN+1];   /* potential tag */
  char patt[MAX_TAG_LEN+1];   /* potential attributes */
  char *buffer = NULL;
  char *ptr;
  char *end;
  union {
    ssize_t sig;
     size_t uns;
  } len;
  size_t bufsize = 0;
  size_t outalloc = 256;
  int in_wanted_part = 0;
  int base64 = 0;
  int error;

  enum {
    STATE_OUTSIDE = 0,
    STATE_OUTER   = 1,
    STATE_INMAIN  = 2,
    STATE_INSUB   = 3,
    STATE_ILLEGAL = 4
  } state = STATE_OUTSIDE;

  *outlen = 0;
  *outbuf = malloc(outalloc);
  if(!*outbuf)
    return GPE_OUT_OF_MEMORY;
  *(*outbuf) = '\0';

  couter[0] = cmain[0] = csub[0] = ptag[0] = patt[0] = '\0';

  while((error = readline(&buffer, &bufsize, stream)) == GPE_OK) {

    ptr = buffer;
    EAT_SPACE(ptr);

    if('<' != *ptr) {
      if(in_wanted_part) {
        show(("=> %s", buffer));
        error = appenddata(outbuf, outlen, &outalloc, buffer, base64);
        if(error)
          break;
      }
      continue;
    }

    ptr++;

    if('/' == *ptr) {
      /*
      ** closing section tag
      */

      ptr++;
      end = ptr;
      EAT_WORD(end);
      if((len.sig = end - ptr) > MAX_TAG_LEN) {
        error = GPE_NO_BUFFER_SPACE;
        break;
      }
      memcpy(ptag, ptr, len.uns);
      ptag[len.uns] = '\0';

      if((STATE_INSUB == state) && !strcmp(csub, ptag)) {
        /* end of current sub section */
        state = STATE_INMAIN;
        csub[0] = '\0';
        if(in_wanted_part) {
          /* end of wanted part */
          in_wanted_part = 0;

          /* Do we need to base64 decode the data? */
          if(base64) {
            error = decodedata(outbuf, outlen);
            if(error)
              return error;
          }
          break;
        }
      }
      else if((STATE_INMAIN == state) && !strcmp(cmain, ptag)) {
        /* end of current main section */
        state = STATE_OUTER;
        cmain[0] = '\0';
        if(in_wanted_part) {
          /* end of wanted part */
          in_wanted_part = 0;

          /* Do we need to base64 decode the data? */
          if(base64) {
            error = decodedata(outbuf, outlen);
            if(error)
              return error;
          }
          break;
        }
      }
      else if((STATE_OUTER == state) && !strcmp(couter, ptag)) {
        /* end of outermost file section */
        state = STATE_OUTSIDE;
        couter[0] = '\0';
        if(in_wanted_part) {
          /* end of wanted part */
          in_wanted_part = 0;
          break;
        }
      }

    }
    else if(!in_wanted_part) {
      /*
      ** opening section tag
      */

      /* get potential tag */
      end = ptr;
      EAT_WORD(end);
      if((len.sig = end - ptr) > MAX_TAG_LEN) {
        error = GPE_NO_BUFFER_SPACE;
        break;
      }
      memcpy(ptag, ptr, len.uns);
      ptag[len.uns] = '\0';

      /* ignore comments, doctypes and xml declarations */
      if(('!' == ptag[0]) || ('?' == ptag[0])) {
        show(("* ignoring (%s)", buffer));
        continue;
      }

      /* get all potential attributes */
      ptr = end;
      EAT_SPACE(ptr);
      end = ptr;
      while(*end && ('>' != *end))
        end++;
      if((len.sig = end - ptr) > MAX_TAG_LEN) {
        error = GPE_NO_BUFFER_SPACE;
        break;
      }
      memcpy(patt, ptr, len.uns);
      patt[len.uns] = '\0';

      if(STATE_OUTSIDE == state) {
        /* outermost element (<testcase>) */
        strcpy(couter, ptag);
        state = STATE_OUTER;
        continue;
      }
      else if(STATE_OUTER == state) {
        /* start of a main section */
        strcpy(cmain, ptag);
        state = STATE_INMAIN;
        continue;
      }
      else if(STATE_INMAIN == state) {
        /* start of a sub section */
        strcpy(csub, ptag);
        state = STATE_INSUB;
        if(!strcmp(cmain, main) && !strcmp(csub, sub)) {
          /* start of wanted part */
          in_wanted_part = 1;
          if(strstr(patt, "base64="))
              /* bit rough test, but "mostly" functional, */
              /* treat wanted part data as base64 encoded */
              base64 = 1;
        }
        continue;
      }

    }

    if(in_wanted_part) {
      show(("=> %s", buffer));
      error = appenddata(outbuf, outlen, &outalloc, buffer, base64);
      if(error)
        break;
    }

  } /* while */

  free(buffer);

  if(error != GPE_OK) {
    if(error == GPE_END_OF_FILE)
      error = GPE_OK;
    else {
      free(*outbuf);
      *outbuf = NULL;
      *outlen = 0;
    }
  }

  return error;
}